

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcombobox.cpp
# Opt level: O0

int __thiscall QComboBoxPrivate::init(QComboBoxPrivate *this,EVP_PKEY_CTX *ctx)

{
  long lVar1;
  bool bVar2;
  QObject *this_00;
  QStandardItemModel *this_01;
  long in_FS_OFFSET;
  bool in_stack_00000023;
  WidgetAttribute in_stack_00000024;
  QComboBox *q;
  FocusPolicy in_stack_ffffffffffffffbc;
  QWidget *in_stack_ffffffffffffffc0;
  QWidget *in_stack_ffffffffffffffd0;
  QObject *pQVar3;
  QStyleOption *in_stack_ffffffffffffffd8;
  QObject *pQVar4;
  QComboBoxPrivate *this_02;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_02 = this;
  this_00 = (QObject *)q_func(this);
  QWidget::setFocusPolicy(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
  pQVar3 = this_00;
  QSizePolicy::QSizePolicy
            ((QSizePolicy *)in_stack_ffffffffffffffd0,(Policy)((ulong)this >> 0x20),(Policy)this,
             (ControlType)((ulong)this_00 >> 0x20));
  QWidget::setSizePolicy
            (in_stack_ffffffffffffffd0,
             (QSizePolicy)SUB84((ulong)in_stack_ffffffffffffffd8 >> 0x20,0));
  QWidgetPrivate::setLayoutItemMargins
            (&this_02->super_QWidgetPrivate,(SubElement)((ulong)pQVar3 >> 0x20),
             in_stack_ffffffffffffffd8);
  pQVar4 = pQVar3;
  this_01 = (QStandardItemModel *)operator_new(0x10);
  QStandardItemModel::QStandardItemModel(this_01,0,1,pQVar4);
  (**(code **)(*(long *)pQVar3 + 0x1a0))(pQVar3,this_01);
  bVar2 = QComboBox::isEditable((QComboBox *)this_00);
  if (bVar2) {
    QWidget::setAttribute(&q->super_QWidget,in_stack_00000024,in_stack_00000023);
  }
  else {
    QWidget::setAttribute(&q->super_QWidget,in_stack_00000024,in_stack_00000023);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (int)*(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void QComboBoxPrivate::init()
{
    Q_Q(QComboBox);
#ifdef Q_OS_MACOS
    // On OS X, only line edits and list views always get tab focus. It's only
    // when we enable full keyboard access that other controls can get tab focus.
    // When it's not editable, a combobox looks like a button, and it behaves as
    // such in this respect.
    if (!q->isEditable())
        q->setFocusPolicy(Qt::TabFocus);
    else
#endif
        q->setFocusPolicy(Qt::WheelFocus);

    q->setSizePolicy(QSizePolicy(QSizePolicy::Preferred, QSizePolicy::Fixed,
                                 QSizePolicy::ComboBox));
    setLayoutItemMargins(QStyle::SE_ComboBoxLayoutItem);
    q->setModel(new QStandardItemModel(0, 1, q));
    if (!q->isEditable())
        q->setAttribute(Qt::WA_InputMethodEnabled, false);
    else
        q->setAttribute(Qt::WA_InputMethodEnabled);
}